

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

SPIRVariable * __thiscall
spirv_cross::CompilerGLSL::find_subpass_input_by_attachment_index(CompilerGLSL *this,uint32_t index)

{
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRVariable *pSVar5;
  SPIRVariable *pSVar6;
  long lVar7;
  LoopLock local_40;
  ParsedIR *local_38;
  
  local_38 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_38);
  pTVar1 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  pSVar6 = (SPIRVariable *)0x0;
  for (lVar7 = 0; sVar2 << 2 != lVar7; lVar7 = lVar7 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar7);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type ==
        TypeVariable) {
      pSVar5 = ParsedIR::get<spirv_cross::SPIRVariable>(local_38,id);
      bVar3 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(pSVar5->super_IVariant).self.id,
                         DecorationInputAttachmentIndex);
      if (bVar3) {
        uVar4 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(pSVar5->super_IVariant).self.id,
                           DecorationInputAttachmentIndex);
        if (uVar4 == index) {
          pSVar6 = pSVar5;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  return pSVar6;
}

Assistant:

const SPIRVariable *CompilerGLSL::find_subpass_input_by_attachment_index(uint32_t index) const
{
	const SPIRVariable *ret = nullptr;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (has_decoration(var.self, DecorationInputAttachmentIndex) &&
		    get_decoration(var.self, DecorationInputAttachmentIndex) == index)
		{
			ret = &var;
		}
	});
	return ret;
}